

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O0

char * maplibrary(GlobalVars *gv,InputFile *ifn)

{
  size_t sVar1;
  char *pcVar2;
  long in_RSI;
  char libname [1024];
  char *p;
  char acStackY_428 [68];
  int in_stack_fffffffffffffc1c;
  char *in_stack_fffffffffffffc20;
  GlobalVars *in_stack_fffffffffffffc28;
  
  sVar1 = strlen(*(char **)(in_RSI + 0x10));
  if (sVar1 < 0x3f0) {
    if (*(int *)(in_RSI + 0x1c) != 0) {
      snprintf(acStackY_428,0x400,"lib%s.so",*(undefined8 *)(in_RSI + 0x10));
      pcVar2 = searchlib(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
                         in_stack_fffffffffffffc1c);
      if (pcVar2 != (char *)0x0) {
        return pcVar2;
      }
    }
    snprintf(acStackY_428,0x400,"lib%s.a",*(undefined8 *)(in_RSI + 0x10));
    pcVar2 = searchlib(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c
                      );
    if (pcVar2 != (char *)0x0) {
      return pcVar2;
    }
    snprintf(acStackY_428,0x400,"%s.lib",*(undefined8 *)(in_RSI + 0x10));
    pcVar2 = searchlib(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c
                      );
    if (pcVar2 != (char *)0x0) {
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

static char *maplibrary(struct GlobalVars *gv,struct InputFile *ifn)
/* Map a complete file into memory and return its address. */
/* The file's length is returned in *(p-sizeof(size_t)). */
/* All defined library paths will be searched for the file, */
/* before aborting. On success, the complete path of the loaded */
/* file is stored in namebuf[]. */
{
  char *p;
  char libname[FNAMEBUFSIZE];

  if (strlen(ifn->name) < (FNAMEBUFSIZE-16)) {
    if (ifn->dynamic) {
      snprintf(libname,FNAMEBUFSIZE,"lib%s.so",ifn->name);
      if (p = searchlib(gv,libname,ifn->so_ver))
        return (p);
    }
    snprintf(libname,FNAMEBUFSIZE,"lib%s.a",ifn->name);
    if (p = searchlib(gv,libname,-1))
      return (p);
    snprintf(libname,FNAMEBUFSIZE,"%s.lib",ifn->name);
    if (p = searchlib(gv,libname,-1))
      return (p);
  }
  return (NULL);
}